

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::BaseRAPass::buildCFGViews(BaseRAPass *this)

{
  uint *puVar1;
  int *piVar2;
  ZoneAllocator *pZVar3;
  long *plVar4;
  RegOnly *pRVar5;
  long lVar6;
  void *pvVar7;
  byte bVar8;
  Error EVar9;
  uint uVar10;
  int iVar11;
  RegOnly RVar12;
  RegOnly RVar13;
  undefined8 extraout_RAX;
  RegOnly RVar14;
  RegOnly RVar15;
  RegOnly RVar16;
  RegOnly RVar17;
  RegOnly RVar18;
  RegOnly RVar19;
  RegOnly RVar20;
  RegOnly RVar21;
  RegOnly RVar22;
  RegOnly RVar23;
  RegOnly RVar24;
  undefined4 extraout_var;
  ZoneAllocator ZVar25;
  char c;
  uint uVar26;
  RegOnly RVar27;
  ulong uVar28;
  long *plVar29;
  BaseBuilder *pBVar30;
  RegOnly RVar31;
  ulong uVar32;
  ulong *puVar33;
  RegOnly RVar34;
  Signature SVar35;
  Logger *this_00;
  RegOnly RVar36;
  RegOnly RVar37;
  RegGroup group;
  BaseNode *pBVar38;
  BaseNode *pBVar39;
  BaseNode *pBVar40;
  RegOnly RVar41;
  RegOnly RVar42;
  RegOnly RVar43;
  undefined1 *puVar44;
  RegOnly RVar45;
  RegOnly RVar46;
  RegOnly RVar47;
  RegOnly this_01;
  BaseRAPass *pBVar48;
  RegOnly RVar49;
  RegOnly RVar50;
  RegOnly RVar51;
  RegOnly RVar52;
  long lVar53;
  long lVar54;
  ulong uVar55;
  uint uVar56;
  RegOnly RVar57;
  RegOnly RVar58;
  RegOnly RVar59;
  RegOnly unaff_R13;
  RegOnly RVar60;
  RegOnly RVar61;
  RegOnly RVar62;
  uint uVar63;
  long lVar64;
  RegOnly RVar65;
  RegOnly RVar66;
  RegOnly RVar67;
  RegOnly RVar68;
  RegOnly RVar69;
  bool bVar70;
  float in_XMM0_Da;
  float fVar71;
  float __x;
  float extraout_XMM0_Da;
  float __x_00;
  float __x_01;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  RABlockVisitItem RVar78;
  ZoneStack<asmjit::v1_14::RABlockVisitItem> stack;
  StringTmp<1024UL> sb;
  undefined1 auStack_e50 [32];
  undefined1 auStack_e30 [1032];
  RegOnly RStack_a28;
  RegOnly RStack_a20;
  RegOnly RStack_a18;
  RegOnly RStack_a10;
  RegOnly RStack_a08;
  RegOnly RStack_a00;
  ulong uStack_9f0;
  ulong uStack_9e8;
  RegOnly RStack_9e0;
  RegOnly RStack_9d8;
  RegOnly RStack_9d0;
  RegOnly RStack_9c8;
  RegOnly RStack_9c0;
  RegOnly RStack_9b8;
  uint uStack_9a4;
  RegOnly RStack_9a0;
  RegOnly RStack_998;
  uint uStack_98c;
  RegOnly RStack_988;
  RegOnly RStack_980;
  RegOnly RStack_978;
  RegOnly RStack_970;
  uint uStack_964;
  RegOnly RStack_960;
  ulong uStack_958;
  ZoneStack<asmjit::v1_14::RABlock_*> ZStack_950;
  RegOnly RStack_930;
  RegOnly RStack_928;
  RegOnly RStack_920;
  RegOnly RStack_918;
  RegOnly RStack_910;
  RegOnly RStack_908;
  undefined1 auStack_900 [16];
  undefined1 auStack_8f0 [16];
  ZoneVectorBase ZStack_8e0;
  ZoneVectorBase ZStack_8d0;
  uint uStack_8c0;
  uint uStack_8bc;
  uint uStack_8b8;
  uint uStack_8b4;
  String SStack_8b0;
  undefined1 auStack_8af [15];
  undefined8 uStack_8a0;
  undefined1 *puStack_898;
  undefined1 auStack_890 [520];
  RegOnly RStack_688;
  RegOnly RStack_680;
  RegOnly RStack_678;
  RegOnly RStack_670;
  RegOnly RStack_668;
  BaseNode *pBStack_660;
  undefined8 uStack_658;
  RegOnly RStack_650;
  RegOnly RStack_648;
  RegOnly RStack_640;
  RegOnly RStack_638;
  RegOnly RStack_630;
  BaseNode *pBStack_628;
  RegOnly RStack_620;
  RegOnly RStack_618;
  RegOnly RStack_610;
  long lStack_608;
  FormatOptions *pFStack_600;
  BaseNode *pBStack_5f8;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined8 uStack_5e0;
  undefined1 *puStack_5d8;
  undefined1 auStack_5d0 [264];
  Logger *pLStack_4c8;
  ulong uStack_4c0;
  RegOnly RStack_4b8;
  RegOnly RStack_4b0;
  BaseRAPass *pBStack_4a8;
  BaseNode *pBStack_4a0;
  ZoneStack<asmjit::v1_14::RABlockVisitItem> local_498;
  long local_478;
  undefined8 uStack_470;
  ZoneAllocator *local_460;
  undefined1 local_458 [32];
  undefined1 local_438 [1032];
  
  if ((this->_diagnosticOptions & kRADebugCFG) == kNone) {
    this_00 = (Logger *)0x0;
  }
  else {
    this_00 = this->_logger;
  }
  if (this_00 != (Logger *)0x0) {
    pBStack_4a0 = (BaseNode *)0x1262b6;
    Logger::logf(this_00,in_XMM0_Da);
  }
  uVar10 = *(uint *)&this->field_0xb8;
  uVar55 = (ulong)uVar10;
  if (uVar10 == 0) {
LAB_001265d1:
    EVar9 = 0;
  }
  else {
    pZVar3 = &this->_allocator;
    pBVar38 = (BaseNode *)0x0;
    if (*(uint *)&this->field_0xdc < uVar10) {
      pBStack_4a0 = (BaseNode *)0x1265ef;
      EVar9 = ZoneVectorBase::_reserve((ZoneVectorBase *)&this->_pov,pZVar3,8,uVar10);
      pBVar38 = (BaseNode *)(ulong)EVar9;
    }
    EVar9 = (Error)pBVar38;
    if (EVar9 == 0) {
      local_498._0_8_ = 0;
      local_498._8_8_ = 0;
      local_498._16_8_ = 0;
      pBStack_4a0 = (BaseNode *)0x1262fb;
      EVar9 = ZoneStackBase::_init(&local_498.super_ZoneStackBase,pZVar3,0x110);
      if (EVar9 == 0) {
        RVar46 = (RegOnly)&local_478;
        local_478 = 0;
        uStack_470 = 0;
        pBStack_4a0 = (BaseNode *)0x12631e;
        EVar9 = ZoneBitVector::_resize((ZoneBitVector *)RVar46,pZVar3,uVar10,uVar10,false);
        if (EVar9 == 0) {
          RVar12 = (RegOnly)pZVar3;
          local_460 = pZVar3;
          if (*(int *)&this->field_0xb8 == 0) {
LAB_00126600:
            pBStack_4a0 = (BaseNode *)0x126605;
            buildCFGViews();
            pBStack_4a0 = pBVar38;
            pBStack_4a8 = this;
            RStack_4b0 = RVar12;
            RStack_4b8 = unaff_R13;
            uStack_4c0 = uVar55;
            pLStack_4c8 = this_00;
            RVar12._id = 0;
            RVar12._signature._bits = *(uint *)((long)RVar46 + 0xb8);
            if (*(uint *)((long)RVar46 + 0xb8) != *(uint *)((long)RVar46 + 0xd8)) {
              fVar71 = 0.0;
              uStack_5ec = 0;
              uStack_5e8 = 0;
              uStack_5e4 = 0;
              uStack_5f0 = 0x20;
              uStack_5e0 = 0x107;
              puStack_5d8 = auStack_5d0;
              auStack_5d0[0] = 0;
              if (((byte)*(ZoneAllocator *)((long)RVar46 + 0x95) & 8) == 0) {
                RVar49._signature._bits = 0;
                RVar49._id = 0;
              }
              else {
                RVar49 = (RegOnly)((ZoneVectorBase *)((long)RVar46 + 0x80))->_data;
              }
              RVar58 = RVar46;
              if (RVar49 != (RegOnly)0x0) {
                pBStack_628 = (BaseNode *)0x126686;
                RVar58 = RVar49;
                fVar71 = Logger::logf((Logger *)RVar49,0.0);
              }
              if (RVar12 != (RegOnly)0x0) {
                pFStack_600 = (FormatOptions *)((long)RVar46 + 0x88);
                RVar65._signature._bits = 0;
                RVar65._id = 0;
                RStack_620 = RVar12;
                do {
                  RVar13._id = 0;
                  RVar13._signature._bits = *(uint *)((long)RVar46 + 0xb8);
                  if ((ulong)RVar13 <= (ulong)RVar65) {
                    pBStack_628 = (BaseNode *)buildCFGDominators;
                    removeUnreachableCode();
                    pBStack_628 = pBVar38;
                    RStack_630 = RVar49;
                    RStack_638 = RVar65;
                    RStack_640 = unaff_R13;
                    RStack_648 = RVar12;
                    RStack_650 = RVar46;
                    uStack_658 = extraout_RAX;
                    if (((byte)*(ZoneAllocator *)((long)RVar58 + 0x95) & 1) == 0) {
                      RVar46._signature._bits = 0;
                      RVar46._id = 0;
                    }
                    else {
                      RVar46 = (RegOnly)((ZoneVectorBase *)((long)RVar58 + 0x80))->_data;
                    }
                    RVar47 = RVar58;
                    fVar71 = __x_00;
                    if (RVar46 != (RegOnly)0x0) {
                      pBStack_660 = (BaseNode *)0x126822;
                      RVar47 = RVar46;
                      fVar71 = Logger::logf((Logger *)RVar46,__x_00);
                    }
                    if (*(int *)((long)RVar58 + 0xb8) == 0) {
                      return 0;
                    }
                    pBVar40 = pBVar38;
                    if (*(int *)((long)RVar58 + 0xb8) == 0) goto LAB_00126966;
                    RVar12 = *(RegOnly *)((ZoneVectorBase *)((long)RVar58 + 0xb0))->_data;
                    *(RegOnly *)((long)RVar12 + 0x50) = RVar12;
                    iVar11 = 0;
                    goto LAB_0012684f;
                  }
                  unaff_R13 = *(RegOnly *)
                               ((long)((ZoneVectorBase *)((long)RVar46 + 0xb0))->_data +
                               (long)RVar65 * 8);
                  if (((byte)*(ZoneAllocator *)((long)unaff_R13 + 0xc) & 2) == 0) {
                    if (RVar49 != (RegOnly)0x0) {
                      pBStack_628 = (BaseNode *)0x1266e0;
                      RVar58 = RVar49;
                      fVar71 = Logger::logf((Logger *)RVar49,fVar71);
                    }
                    RStack_610 = RVar65;
                    pBVar38 = (BaseNode *)((ZoneVectorBase *)((long)unaff_R13 + 0x10))->_data;
                    RStack_618 = unaff_R13;
                    lStack_608 = *(long *)pBVar38;
                    pBVar40 = *(BaseNode **)(*(long *)((long)unaff_R13 + 0x18) + 8);
                    if (pBVar38 != pBVar40) {
                      pBStack_5f8 = pBVar40;
                      pBVar39 = pBVar38;
                      do {
                        pBVar38 = *(BaseNode **)(pBVar39 + 8);
                        if (((byte)pBVar39[0x11] & 9) != 0) {
                          if (RVar49 != (RegOnly)0x0) {
                            pBStack_628 = (BaseNode *)0x12672b;
                            String::clear((String *)&uStack_5f0);
                            pBStack_628 = (BaseNode *)0x126742;
                            Formatter::formatNode
                                      ((String *)&uStack_5f0,pFStack_600,
                                       *(BaseBuilder **)((long)RVar46 + 8),pBVar39);
                            pBStack_628 = (BaseNode *)0x126767;
                            Logger::logf((Logger *)RVar49,__x);
                            unaff_R13 = RVar46;
                            pBVar40 = pBStack_5f8;
                          }
                          RVar58 = *(RegOnly *)((long)RVar46 + 8);
                          pBStack_628 = (BaseNode *)0x12677b;
                          BaseBuilder::removeNode((BaseBuilder *)RVar58,pBVar39);
                          fVar71 = extraout_XMM0_Da;
                        }
                        pBVar39 = pBVar38;
                      } while (pBVar38 != pBVar40);
                    }
                    RVar12 = RStack_620;
                    RVar65 = RStack_610;
                    if (*(BaseNode **)(lStack_608 + 8) == pBVar40) {
                      fVar71 = 0.0;
                      *(undefined4 *)&((ZoneVectorBase *)((long)RStack_618 + 0x10))->_data = 0;
                      *(undefined4 *)((long)RStack_618 + 0x14) = 0;
                      *(undefined4 *)((long)RStack_618 + 0x18) = 0;
                      *(undefined4 *)((long)RStack_618 + 0x1c) = 0;
                    }
                    else {
                      ((ZoneVectorBase *)((long)RStack_618 + 0x10))->_data =
                           *(BaseNode **)(lStack_608 + 8);
                      *(undefined8 *)((long)RStack_618 + 0x18) = *(undefined8 *)pBVar40;
                    }
                  }
                  RVar65 = (RegOnly)((long)RVar65 + 1);
                } while (RVar65 != RVar12);
              }
              pBStack_628 = (BaseNode *)0x1267d1;
              String::reset((String *)&uStack_5f0);
            }
            return 0;
          }
          RVar12 = **(RegOnly **)&this->_blocks;
          uVar55 = 0;
          do {
            while (*(uint *)&((ZoneVectorBase *)((long)RVar12 + 0x70))->_data <= (uint)uVar55) {
              *(ZoneAllocator *)((long)RVar12 + 0xc) =
                   (ZoneAllocator)((byte)*(ZoneAllocator *)((long)RVar12 + 0xc) | 2);
              uVar10 = *(uint *)&this->field_0xd8;
              *(uint *)((long)RVar12 + 0x2c) = uVar10;
              if (*(uint *)&this->field_0xdc <= uVar10) {
                pBStack_4a0 = (BaseNode *)0x1265fb;
                buildCFGViews();
LAB_001265fb:
                pBStack_4a0 = (BaseNode *)0x126600;
                buildCFGViews();
                goto LAB_00126600;
              }
              *(RegOnly *)(*(long *)&this->_pov + (ulong)uVar10 * 8) = RVar12;
              *(int *)&this->field_0xd8 = *(int *)&this->field_0xd8 + 1;
              if (local_498._0_8_ == 0) goto LAB_001265fb;
              if (*(long *)(local_498._8_8_ + 0x10) == *(long *)(local_498._16_8_ + 0x18)) {
                if (this_00 != (Logger *)0x0) {
                  local_458._24_8_ = local_438;
                  local_458._8_8_ = (BaseBuilder *)0x0;
                  local_458._0_8_ = (_func_int **)0x20;
                  local_458._16_8_ = (char *)0x407;
                  local_438[0] = 0;
                  uVar10 = *(uint *)&this->field_0xb8;
                  if ((ulong)uVar10 != 0) {
                    lVar6 = *(long *)&this->_blocks;
                    lVar64 = 0;
                    do {
                      lVar54 = *(long *)(lVar6 + lVar64);
                      pBStack_4a0 = (BaseNode *)0x126508;
                      String::clear((String *)local_458);
                      if (*(int *)(lVar54 + 0x70) == 0) {
                        pBStack_4a0 = (BaseNode *)0x126572;
                        String::_opFormat((String *)local_458,kAppend,"  #%u -> {Exit}\n",
                                          (ulong)*(uint *)(lVar54 + 8));
                      }
                      else {
                        pBStack_4a0 = (BaseNode *)0x12652f;
                        pBVar48 = (BaseRAPass *)local_458;
                        String::_opFormat((String *)local_458,kAppend,"  #%u -> {",
                                          (ulong)*(uint *)(lVar54 + 8));
                        pBStack_4a0 = (BaseNode *)0x12653a;
                        _dumpBlockIds(pBVar48,(String *)local_458,(RABlocks *)(lVar54 + 0x68));
                        pBStack_4a0 = (BaseNode *)0x126555;
                        String::_opString((String *)local_458,kAppend,"}\n",0xffffffffffffffff);
                      }
                      pBVar30 = (BaseBuilder *)(local_458._0_8_ & 0xff);
                      puVar44 = local_458 + 1;
                      if ((BaseBuilder *)0x1e < (BaseBuilder *)(local_458._0_8_ & 0xff)) {
                        pBVar30 = (BaseBuilder *)local_458._8_8_;
                        puVar44 = (undefined1 *)local_458._24_8_;
                      }
                      pBStack_4a0 = (BaseNode *)0x126595;
                      (*this_00->_vptr_Logger[2])(this_00,puVar44,pBVar30);
                      lVar64 = lVar64 + 8;
                    } while ((ulong)uVar10 << 3 != lVar64);
                  }
                  pBStack_4a0 = (BaseNode *)0x1265ac;
                  String::reset((String *)local_458);
                }
                pBStack_4a0 = (BaseNode *)0x1265bb;
                ZoneBitVector::release((ZoneBitVector *)&local_478,local_460);
                pBVar38 = (BaseNode *)0x0;
                goto LAB_00126325;
              }
              pBStack_4a0 = (BaseNode *)0x1264a1;
              RVar46 = (RegOnly)&local_498;
              RVar78 = ZoneStack<asmjit::v1_14::RABlockVisitItem>::pop(&local_498);
              uVar55 = (ulong)RVar78._index;
              RVar12 = (RegOnly)RVar78._block;
            }
            unaff_R13 = *(RegOnly *)(*(long *)((long)RVar12 + 0x68) + uVar55 * 8);
            uVar10 = *(uint *)((long)unaff_R13 + 8);
            if ((uint)uStack_470 <= uVar10) {
              pBStack_4a0 = (BaseNode *)0x1265c7;
              buildCFGViews();
LAB_001265c7:
              pBStack_4a0 = (BaseNode *)0x1265cc;
              buildCFGViews();
LAB_001265cc:
              pBStack_4a0 = (BaseNode *)0x1265d1;
              buildCFGViews();
              goto LAB_001265d1;
            }
            uVar56 = (uint)uVar55 + 1;
            uVar55 = (ulong)uVar56;
            RVar46 = (RegOnly)(1L << ((byte)uVar10 & 0x3f));
            uVar28 = *(ulong *)(local_478 + (ulong)(uVar10 >> 6) * 8);
            iVar11 = 0xd;
            if ((uVar28 >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
              *(ulong *)(local_478 + (ulong)(uVar10 >> 6) * 8) = uVar28 | (ulong)RVar46;
              if (local_498._0_8_ == 0) goto LAB_001265cc;
              if (local_498._16_8_ + 0x1f0 < *(ulong *)(local_498._16_8_ + 0x18)) {
                pBStack_4a0 = (BaseNode *)0x1263e6;
                RVar46 = (RegOnly)&local_498;
                uVar10 = ZoneStackBase::_prepareBlock(&local_498.super_ZoneStackBase,1,0x20);
                if (uVar10 == 0) goto LAB_001263ef;
              }
              else {
LAB_001263ef:
                pRVar5 = *(RegOnly **)(local_498._16_8_ + 0x18);
                if ((pRVar5 < (RegOnly *)(local_498._16_8_ + 0x20)) ||
                   ((RegOnly *)(local_498._16_8_ + 0x1f0) < pRVar5)) goto LAB_001265c7;
                *pRVar5 = RVar12;
                pRVar5[1]._signature._bits = uVar56;
                *(RegOnly **)(local_498._16_8_ + 0x18) = pRVar5 + 2;
                uVar10 = 0;
              }
              iVar11 = 1;
              if (uVar10 == 0) {
                uVar55 = 0;
                iVar11 = 0;
                RVar12 = unaff_R13;
              }
              else {
                pBVar38 = (BaseNode *)(ulong)uVar10;
              }
            }
          } while ((iVar11 == 0xd) || (iVar11 == 0));
        }
        else {
          pBVar38 = (BaseNode *)(ulong)EVar9;
        }
      }
      else {
        pBVar38 = (BaseNode *)(ulong)EVar9;
      }
LAB_00126325:
      EVar9 = (Error)pBVar38;
      pBStack_4a0 = (BaseNode *)0x126331;
      ZoneStackBase::_init(&local_498.super_ZoneStackBase,(ZoneAllocator *)0x0,0);
    }
  }
  return EVar9;
LAB_00127b57:
  RStack_9b8._signature._bits = 0x127b65;
  RStack_9b8._id = 0;
  ZoneStackBase::_init(&ZStack_950.super_ZoneStackBase,(ZoneAllocator *)0x0,0);
  RStack_9b8._signature._bits = 0x127b77;
  RStack_9b8._id = 0;
  ZoneBitVector::release((ZoneBitVector *)auStack_900,(ZoneAllocator *)RStack_988);
  bVar70 = true;
LAB_00126ef3:
  this_01 = (RegOnly)&ZStack_950;
  RStack_9b8._signature._bits = 0x126f01;
  RStack_9b8._id = 0;
  ZoneStackBase::_init((ZoneStackBase *)this_01,(ZoneAllocator *)0x0,0);
  RVar61 = RVar62;
  if (!bVar70) goto LAB_00127ba5;
  if (RVar58 != (RegOnly)0x0) {
    RStack_9b8._signature._bits = 0x126f26;
    RStack_9b8._id = 0;
    this_01 = RVar58;
    Logger::logf((Logger *)RVar58,__x_01);
    if (RStack_960 != (RegOnly)0x0) {
      RVar37 = (RegOnly)&SStack_8b0;
      RVar66._signature._bits = 0;
      RVar66._id = 0;
      do {
        RVar46 = RStack_9a0;
        RVar15._id = 0;
        RVar15._signature._bits = *(uint *)((long)RStack_9a0 + 0xb8);
        RVar41 = RStack_9a0;
        if ((ulong)RVar15 <= (ulong)RVar66) goto LAB_00127c30;
        RVar69 = *(RegOnly *)(*(long *)((long)RStack_9a0 + 0xb0) + (long)RVar66 * 8);
        RStack_9b8._signature._bits = 0x126f73;
        RStack_9b8._id = 0;
        EVar9 = String::_opFormat((String *)RVar37,kAssign,"  {#%u}\n",
                                  (ulong)*(uint *)((long)RVar69 + 8));
        if (EVar9 != 0) {
          RVar61._id = 0;
          RVar61._signature._bits = EVar9;
          goto LAB_00127ba5;
        }
        RStack_9b8._signature._bits = 0x126f8d;
        RStack_9b8._id = 0;
        _dumpBlockLiveness((BaseRAPass *)RVar46,(String *)RVar37,(RABlock *)RVar69);
        uVar55 = (ulong)(byte)SStack_8b0;
        puVar44 = auStack_8af;
        if (0x1e < (ulong)(byte)SStack_8b0) {
          uVar55 = auStack_8af._7_8_;
          puVar44 = puStack_898;
        }
        RStack_9b8._signature._bits = 0x126fbd;
        RStack_9b8._id = 0;
        this_01 = RVar58;
        (**(code **)(*(long *)RVar58 + 0x10))(RVar58,puVar44,uVar55);
        RVar66 = (RegOnly)((long)RVar66 + 1);
      } while (RStack_960 != RVar66);
    }
  }
  RVar66._signature._bits =
       RStack_978._signature._bits._bits + (uint)(RStack_978._signature._bits._bits == 0);
  RVar66._id = 0;
  RVar36._signature._bits = 0;
  RVar36._id = 0;
  RVar46 = RStack_9a0;
  RVar12 = RStack_988;
  RVar49 = RVar62;
  do {
    RVar16._id = 0;
    RVar16._signature._bits = *(uint *)((long)RVar46 + 0x148);
    RVar37 = RVar36;
    RVar41 = RVar46;
    if ((ulong)RVar16 <= (ulong)RVar36) goto LAB_00127c12;
    RVar17._id = 0;
    RVar17._signature._bits = ZStack_8d0._size;
    if ((ulong)RVar17 <= (ulong)RVar36) goto LAB_00127c17;
    RVar62 = *(RegOnly *)
              ((long)((ZoneVectorBase *)((long)RVar46 + 0x140))->_data + (long)RVar36 * 8);
    uVar10 = *(uint *)((long)ZStack_8d0._data + (long)RVar36 * 4);
    uVar56 = 0;
    if (*(uint *)((long)RVar62 + 0x7c) < uVar10) {
      this_01 = (RegOnly)((long)RVar62 + 0x70);
      RStack_9b8._signature._bits = 0x127089;
      RStack_9b8._id = 0;
      uVar56 = ZoneVectorBase::_reserve((ZoneVectorBase *)this_01,(ZoneAllocator *)RVar12,8,uVar10);
      RVar46 = RStack_9a0;
      RVar12 = RStack_988;
    }
    if (uVar56 == 0) {
      RVar18._id = 0;
      RVar18._signature._bits = ZStack_8e0._size;
      RVar41 = RVar46;
      if ((ulong)RVar18 <= (ulong)RVar36) goto LAB_00127c3a;
      uVar10 = *(uint *)((long)ZStack_8e0._data + (long)RVar36 * 4);
      uVar56 = 0;
      RVar37 = RVar12;
      if (*(uint *)((long)RVar62 + 0x8c) < uVar10) {
        RVar62 = (RegOnly)((long)RVar62 + 0x80);
        RStack_9b8._signature._bits = 0x1270ac;
        RStack_9b8._id = 0;
        this_01 = RVar62;
        uVar56 = ZoneVectorBase::_reserve((ZoneVectorBase *)RVar62,(ZoneAllocator *)RVar12,8,uVar10)
        ;
        RVar46 = RStack_9a0;
        RVar37 = RStack_988;
      }
      bVar70 = uVar56 == 0;
      RVar41 = RVar49;
      if (!bVar70) {
        RVar41._id = 0;
        RVar41._signature._bits = uVar56;
      }
    }
    else {
      RVar41._id = 0;
      RVar41._signature._bits = uVar56;
      bVar70 = false;
      RVar37 = RVar12;
    }
    RVar61 = RVar41;
    if (!bVar70) goto LAB_00127ba5;
    RVar36 = (RegOnly)((long)RVar36 + 1);
    RVar12 = RVar37;
    RVar49 = RVar41;
  } while (RVar66 != RVar36);
  RStack_9b8._signature._bits = 0x1270d6;
  RStack_9b8._id = 0;
  ZoneVector<unsigned_int>::release((ZoneVector<unsigned_int> *)&ZStack_8d0,(ZoneAllocator *)RVar37)
  ;
  this_01 = (RegOnly)&ZStack_8e0;
  RStack_9b8._signature._bits = 0x1270e6;
  RStack_9b8._id = 0;
  ZoneVector<unsigned_int>::release((ZoneVector<unsigned_int> *)this_01,(ZoneAllocator *)RVar37);
  RVar46 = RStack_9a0;
  if (RStack_960 != (RegOnly)0x0) {
    RVar42._signature._bits = 2;
    RVar42._id = 0;
    RVar45._signature._bits = 0;
    RVar45._id = 0;
    RVar12 = RVar41;
    RVar51 = RVar41;
    RVar49 = RStack_960;
    RStack_978 = RVar66;
LAB_00127114:
    RVar19._id = 0;
    RVar19._signature._bits = *(uint *)((long)RVar46 + 0xb8);
    if ((ulong)RVar19 <= (ulong)RVar45) goto LAB_00127c5d;
    uStack_958 = *(ulong *)((long)((ZoneVectorBase *)((long)RVar46 + 0xb0))->_data +
                           (long)RVar45 * 8);
    iVar11 = 0x3e;
    RVar41 = RVar12;
    if ((*(byte *)(uStack_958 + 0xc) & 2) == 0) goto LAB_0012777b;
    RVar20._id = 0;
    RVar20._signature._bits = auStack_8f0._8_4_;
    if ((ulong)RVar20 <= (ulong)RVar45) goto LAB_00127c62;
    RStack_910._signature._bits = *(uint32_t *)(uStack_958 + 8);
    RVar41 = *(RegOnly *)(uStack_958 + 0x10);
    RStack_930 = *(RegOnly *)(uStack_958 + 0x18);
    uStack_9a4 = RVar42._signature._bits._bits + *(int *)(auStack_8f0._0_8_ + (long)RVar45 * 4) * 2;
    *(uint32_t *)(uStack_958 + 0x20) = RVar42._signature._bits._bits;
    *(uint *)(uStack_958 + 0x24) = uStack_9a4;
    ZStack_950._0_16_ = ZEXT816(0);
    RVar66 = *(RegOnly *)(uStack_958 + 0x78);
    RVar37._signature._bits = *(int *)(uStack_958 + 0x80) + 0x3fU & 0xffffffc0;
    RVar37._id = 0;
    RStack_998 = RVar45;
    if (RVar37._signature._bits == 0) {
      RVar68._signature._bits = 0;
      RVar68._id = 0;
LAB_001271c0:
      RVar57._signature._bits = 0;
      RVar57._id = 0;
    }
    else {
      RVar57 = *(RegOnly *)RVar66;
      RVar66 = (RegOnly)((long)RVar66 + 8);
      if (RVar57 == (RegOnly)0x0) {
        RVar21._signature._bits = 0x40;
        RVar21._id = 0;
        do {
          RVar68 = RVar21;
          if ((ulong)RVar37 <= (ulong)RVar68) goto LAB_001271c0;
          RVar57 = *(RegOnly *)RVar66;
          RVar66 = (RegOnly)((long)RVar66 + 8);
          RVar21 = (RegOnly)((long)RVar68 + 0x40);
        } while (RVar57 == (RegOnly)0x0);
      }
      else {
        RVar68._signature._bits = 0;
        RVar68._id = 0;
      }
    }
    do {
      RVar62 = RVar41;
      RVar69 = RVar68;
      if (RVar57 == (RegOnly)0x0) {
        uVar10 = 0;
        uVar56 = 0;
        uVar26 = 0;
        uVar77 = 0;
        RVar45 = RStack_998;
        this_01 = RStack_930;
        RVar58 = RStack_980;
        RVar66 = RStack_978;
        goto LAB_00127315;
      }
      RVar58 = (RegOnly)((ulong)((long)RVar57 + -1) & (ulong)RVar57);
      while ((RVar58 == (RegOnly)0x0 &&
             (RVar69 = (RegOnly)((long)RVar69 + 0x40), (ulong)RVar69 < (ulong)RVar37))) {
        RVar58 = *(RegOnly *)RVar66;
        RVar66 = (RegOnly)((long)RVar66 + 8);
      }
      lVar6 = 0;
      if (RVar57 != (RegOnly)0x0) {
        for (; ((ulong)RVar57 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
        }
      }
      uVar55 = (ulong)((int)lVar6 + RVar68._signature._bits._bits);
      if (*(uint *)((long)RVar46 + 0x148) <= uVar55) goto LAB_00127bfe;
      RVar62 = *(RegOnly *)((long)((ZoneVectorBase *)((long)RVar46 + 0x140))->_data + uVar55 * 8);
      bVar8 = (byte)*(ZoneAllocator *)((long)RVar62 + 0x21) & 0xf;
      if (3 < bVar8) goto LAB_00127c03;
      *(int *)(&ZStack_950.super_ZoneStackBase + (ulong)bVar8 * 4) =
           *(int *)(&ZStack_950.super_ZoneStackBase + (ulong)bVar8 * 4) + 1;
      this_01 = (RegOnly)((long)RVar62 + 0x50);
      iVar11 = *(int *)((long)RVar62 + 0x58);
      if (iVar11 == 0) {
LAB_0012725e:
        if (iVar11 != *(int *)((long)RVar62 + 0x5c)) {
LAB_00127264:
          pvVar7 = ((ZoneVectorBase *)((long)RVar62 + 0x50))->_data;
          uVar55 = (ulong)*(uint *)((long)RVar62 + 0x58);
          *(uint32_t *)((long)pvVar7 + uVar55 * 0xc) = RVar42._signature._bits._bits;
          *(uint *)((long)pvVar7 + uVar55 * 0xc + 4) = uStack_9a4;
          *(undefined4 *)((long)pvVar7 + uVar55 * 0xc + 8) = 0xff;
          *(int *)((long)RVar62 + 0x58) = *(int *)((long)RVar62 + 0x58) + 1;
          goto LAB_00127298;
        }
        uStack_98c = (uint)RVar51._signature._bits;
        RStack_9b8._signature._bits = 0x1272cf;
        RStack_9b8._id = 0;
        RStack_918 = RVar42;
        uVar10 = ZoneVectorBase::_grow((ZoneVectorBase *)this_01,(ZoneAllocator *)RStack_988,0xc,1);
        RVar51._id = 0;
        RVar51._signature._bits = uStack_98c;
        RVar42 = RStack_918;
        RVar49 = RStack_960;
        RVar46 = RStack_9a0;
        if (uVar10 == 0) goto LAB_00127264;
      }
      else {
        if (*(uint *)(*(long *)this_01 + 4 + (ulong)(iVar11 - 1) * 0xc) <
            RVar42._signature._bits._bits) goto LAB_0012725e;
        *(uint *)(*(long *)this_01 + (ulong)(iVar11 - 1) * 0xc + 4) = uStack_9a4;
LAB_00127298:
        uVar10 = 0;
      }
      RVar12 = RVar41;
      RVar57 = RVar58;
      RVar68 = RVar69;
    } while (uVar10 == 0);
    RVar51._id = 0;
    RVar51._signature._bits = uVar10;
    iVar11 = 1;
    RVar45 = RStack_998;
    RVar58 = RStack_980;
    RVar62 = RVar41;
    RVar66 = RStack_978;
LAB_0012777b:
    SVar35 = RVar51._signature._bits;
    if ((iVar11 != 0x3e) && (iVar11 != 0)) goto LAB_00126a90;
    RVar45 = (RegOnly)((long)RVar45 + 1);
    RVar12 = RVar41;
    if (RVar45 == RVar49) goto LAB_00127a4e;
    goto LAB_00127114;
  }
LAB_00127a4e:
  RVar24._id = 0;
  RVar24._signature._bits = *(uint *)((long)RVar46 + 0x148);
  lVar6 = *(long *)((long)RVar46 + 0x140);
  RVar34._signature._bits = 0;
  RVar34._id = 0;
  do {
    if (RVar34 == RVar24) goto LAB_00127c2b;
    lVar64 = *(long *)(lVar6 + (long)RVar34 * 8);
    if ((ulong)*(uint *)(lVar64 + 0x58) == 0) {
      uVar10 = 0;
    }
    else {
      lVar54 = 0;
      uVar10 = 0;
      do {
        uVar10 = (uVar10 + *(int *)(*(long *)(lVar64 + 0x50) + 4 + lVar54)) -
                 *(int *)(*(long *)(lVar64 + 0x50) + lVar54);
        lVar54 = lVar54 + 0xc;
      } while ((ulong)*(uint *)(lVar64 + 0x58) * 0xc != lVar54);
    }
    if (uVar10 == 0) {
      fVar71 = 0.0;
    }
    else {
      fVar71 = (float)((double)*(uint *)(lVar64 + 0x78) / (double)uVar10);
    }
    *(uint *)(lVar64 + 0x60) = uVar10;
    *(float *)(lVar64 + 100) = fVar71;
    bVar8 = *(byte *)(*(long *)(lVar64 + 8) + 0xe);
    this_01._1_7_ = 0;
    this_01._signature._bits._0_1_ = bVar8;
    *(float *)(lVar64 + 0x68) = (float)bVar8 * 0.01 + fVar71;
    RVar34 = (RegOnly)((long)RVar34 + 1);
  } while (RVar34 != RVar66);
  if (RVar58 != (RegOnly)0x0) {
    RStack_9b8._signature._bits = 0x127b17;
    RStack_9b8._id = 0;
    String::clear(&SStack_8b0);
    RStack_9b8._signature._bits = 0x127b22;
    RStack_9b8._id = 0;
    _dumpLiveSpans((BaseRAPass *)RVar46,&SStack_8b0);
    uVar55 = (ulong)(byte)SStack_8b0;
    if (uVar55 < 0x1f) {
      puVar44 = auStack_8af;
    }
    else {
      uVar55 = auStack_8af._7_8_;
      puVar44 = puStack_898;
    }
    RStack_9b8._signature._bits = 0x127b90;
    RStack_9b8._id = 0;
    (**(code **)(*(long *)RVar58 + 0x10))(RVar58,puVar44,uVar55);
  }
  RStack_9b8._signature._bits = 0x127ba2;
  RStack_9b8._id = 0;
  ZoneVector<unsigned_int>::release
            ((ZoneVector<unsigned_int> *)auStack_8f0,(ZoneAllocator *)RStack_988);
  goto LAB_00127ba2;
LAB_00127315:
  RVar41 = RVar12;
  if (((byte)*(ZoneAllocator *)((long)RVar62 + 0x11) & 0x20) != 0) {
    RVar12 = (RegOnly)((ZoneVectorBase *)((long)RVar62 + 0x20))->_data;
    if (RVar12 == (RegOnly)0x0) goto LAB_00127c3f;
    uVar63 = *(uint *)&((ZoneVectorBase *)((long)RVar12 + 0x10))->_data;
    RVar69._id = 0;
    RVar69._signature._bits = uVar63;
    *(uint32_t *)((long)RVar62 + 0x14) = RVar42._signature._bits._bits;
    RStack_928 = (RegOnly)((long)RVar12 + 0x1c);
    *(undefined4 *)((long)RVar12 + 0x1c) = ZStack_950._0_4_;
    *(undefined4 *)&((ZoneVectorBase *)((long)RVar12 + 0x20))->_data = ZStack_950._4_4_;
    *(undefined4 *)((long)RVar12 + 0x24) = ZStack_950._8_4_;
    *(undefined4 *)((long)RVar12 + 0x28) = ZStack_950._12_4_;
    iVar11 = 0x47;
    RVar41._signature._bits._0_1_ = uVar63 != 0;
    if (uVar63 != 0) {
      RStack_908._signature._bits = -uVar63;
      RStack_908._id = 0;
      RVar58 = (RegOnly)((long)RVar12 + 0x60);
      RVar37._signature._bits = 1;
      RVar37._id = 0;
      RStack_920 = RVar62;
      RStack_970 = RVar12;
      uStack_964 = uVar63;
      do {
        uVar63 = *(uint *)((long)RVar58 + -0x14);
        RVar62 = RStack_920;
        if (*(uint *)((long)RVar46 + 0x148) <= uVar63) goto LAB_00127bd1;
        RVar69 = *(RegOnly *)
                  ((long)((ZoneVectorBase *)((long)RVar46 + 0x140))->_data + (ulong)uVar63 * 8);
        if (*(uint *)((long)RVar69 + 0x7c) <= *(uint *)((long)RVar69 + 0x78)) goto LAB_00127bd6;
        *(RegOnly *)
         ((long)((ZoneVectorBase *)((long)RVar69 + 0x70))->_data +
         (ulong)*(uint *)((long)RVar69 + 0x78) * 8) = RStack_920;
        *(int *)((long)RVar69 + 0x78) = *(int *)((long)RVar69 + 0x78) + 1;
        if (((byte)*(ZoneAllocator *)((long)RVar58 + -0xc) & 2) != 0) {
          if (*(uint *)((long)RVar69 + 0x8c) <= *(uint *)((long)RVar69 + 0x88)) goto LAB_00127be0;
          *(RegOnly *)
           ((long)((ZoneVectorBase *)((long)RVar69 + 0x80))->_data +
           (ulong)*(uint *)((long)RVar69 + 0x88) * 8) = RStack_920;
          *(int *)((long)RVar69 + 0x88) = *(int *)((long)RVar69 + 0x88) + 1;
        }
        if (*(uint32_t *)((long)RVar69 + 0x28) != RStack_910._signature._bits) {
          *(undefined4 *)((long)RVar69 + 0x28) = 0xffffffff;
          *(ZoneAllocator *)((long)RVar69 + 0x24) =
               (ZoneAllocator)((byte)*(ZoneAllocator *)((long)RVar69 + 0x24) | 4);
        }
        if ((*(uint *)((long)RVar58 + -0xc) >> 0x11 & 1) != 0) {
          if (*(uint *)(uStack_958 + 0x90) <= uVar63) goto LAB_00127be5;
          if ((*(ulong *)(*(long *)(uStack_958 + 0x88) + (ulong)(uVar63 >> 6) * 8) >>
               ((ulong)uVar63 & 0x3f) & 1) == 0) {
            *(uint *)((long)RVar58 + -0xc) = *(uint *)((long)RVar58 + -0xc) | 0x40000;
          }
        }
        RVar62 = (RegOnly)((long)RVar69 + 0x50);
        uVar63 = (~*(uint *)((long)RVar58 + -0xc) & 1) + RVar42._signature._bits._bits;
        iVar11 = *(int *)((long)RVar69 + 0x58);
        if (iVar11 == 0) {
LAB_0012746f:
          if (iVar11 != *(int *)((long)RVar69 + 0x5c)) {
LAB_00127479:
            pvVar7 = ((ZoneVectorBase *)((long)RVar69 + 0x50))->_data;
            uVar55 = (ulong)*(uint *)((long)RVar69 + 0x58);
            *(uint *)((long)pvVar7 + uVar55 * 0xc) = uVar63;
            *(uint *)((long)pvVar7 + uVar55 * 0xc + 4) = uStack_9a4;
            *(undefined4 *)((long)pvVar7 + uVar55 * 0xc + 8) = 0xff;
            *(int *)((long)RVar69 + 0x58) = *(int *)((long)RVar69 + 0x58) + 1;
            bVar70 = false;
            goto LAB_001274af;
          }
          uStack_98c = (uint)RVar51._signature._bits;
          RStack_9b8._signature._bits = 0x12761e;
          RStack_9b8._id = 0;
          this_01 = RVar62;
          RStack_918 = RVar42;
          uStack_8c0 = uVar10;
          uStack_8bc = uVar56;
          uStack_8b8 = uVar26;
          uStack_8b4 = uVar77;
          uVar72 = ZoneVectorBase::_grow((ZoneVectorBase *)RVar62,(ZoneAllocator *)RStack_988,0xc,1)
          ;
          RVar51._id = 0;
          RVar51._signature._bits = uStack_98c;
          RVar42 = RStack_918;
          RVar49 = RStack_960;
          RVar46 = RStack_9a0;
          uVar10 = uStack_8c0;
          uVar56 = uStack_8bc;
          uVar26 = uStack_8b8;
          uVar77 = uStack_8b4;
          if (uVar72 == 0) goto LAB_00127479;
          bVar70 = false;
        }
        else {
          uVar72 = *(uint *)(*(long *)RVar62 + 4 + (ulong)(iVar11 - 1) * 0xc);
          if (uVar72 < uVar63) goto LAB_0012746f;
          bVar70 = uVar63 < uVar72;
          *(uint *)(*(long *)RVar62 + 4 + (ulong)(iVar11 - 1) * 0xc) = uStack_9a4;
LAB_001274af:
          uVar72 = 0;
        }
        RVar45 = RStack_998;
        RVar66 = RStack_978;
        if (uVar72 != 0) {
          RVar51._id = 0;
          RVar51._signature._bits = uVar72;
          iVar11 = 1;
          this_01 = RStack_930;
          RVar58 = RStack_980;
          RVar62 = RStack_920;
          goto LAB_00127690;
        }
        bVar8 = (byte)*(ZoneAllocator *)((long)RVar69 + 0x21) & 0xf;
        uVar55 = (ulong)(byte)*(ZoneAllocator *)((long)RVar69 + 0x21) & 0xf;
        if (!bVar70) {
          if (3 < bVar8) goto LAB_00127bea;
          uVar28 = (ulong)(uint)((int)uVar55 * 4);
          *(int *)(&ZStack_950.super_ZoneStackBase + uVar28) =
               *(int *)(&ZStack_950.super_ZoneStackBase + uVar28) + 1;
          pZVar3 = (ZoneAllocator *)((long)RStack_928 + uVar28);
          *(int *)pZVar3 = *(int *)pZVar3 + 1;
        }
        uVar63 = *(uint *)((long)RVar58 + -0xc);
        if ((uVar63 >> 0x12 & 1) != 0) {
          if (*(int *)((long)RVar69 + 0x58) == 0) goto LAB_00127bef;
          this_01 = *(RegOnly *)RVar62;
          *(uint32_t *)
           ((ZoneAllocator *)((long)this_01 + 4) + (ulong)(*(int *)((long)RVar69 + 0x58) - 1) * 0xc)
               = RVar42._signature._bits._bits - (uVar63 | 0xfffffffe);
          if (3 < bVar8) goto LAB_00127bf4;
          *(int *)(&ZStack_950.super_ZoneStackBase + uVar55 * 4) =
               *(int *)(&ZStack_950.super_ZoneStackBase + uVar55 * 4) + -1;
          RVar41 = RVar42;
        }
        ZVar25 = *(ZoneAllocator *)((long)RVar58 + -6);
        RVar62 = RStack_920;
        if (ZVar25 != (ZoneAllocator)0xff) {
          this_01._signature._bits = 1 << ((byte)ZVar25 & 0x1f);
          this_01._id = 0;
          *(uint *)((long)RVar69 + 0x2c) = *(uint *)((long)RVar69 + 0x2c) | this_01._signature._bits
          ;
          if (*(ZoneAllocator *)((long)RVar69 + 0x4b) == (ZoneAllocator)0xff) {
            if (3 < bVar8) goto LAB_00127c1c;
            RVar41 = RStack_970;
            if ((*(uint *)((ZoneAllocator *)((long)RStack_970 + 0x3c) + uVar55 * 4) &
                this_01._signature._bits) == 0) {
              *(ZoneAllocator *)((long)RVar69 + 0x4b) = ZVar25;
            }
          }
        }
        uVar72 = *(uint *)((long)RVar58 + -4);
        if ((uVar72 != 0) &&
           (*(uint *)&((ZoneVectorBase *)((long)RVar69 + 0x30))->_data =
                 *(uint *)&((ZoneVectorBase *)((long)RVar69 + 0x30))->_data & uVar72,
           ((byte)*(ZoneAllocator *)((long)RVar69 + 0x24) & 0x10) != 0)) {
          *(uint *)((long)RVar69 + 0x34) = *(uint *)((long)RVar69 + 0x34) & uVar72;
        }
        uVar72 = *(uint *)RVar58;
        if ((uVar72 != 0) &&
           (*(uint *)&((ZoneVectorBase *)((long)RVar69 + 0x30))->_data =
                 *(uint *)&((ZoneVectorBase *)((long)RVar69 + 0x30))->_data & uVar72,
           ((byte)*(ZoneAllocator *)((long)RVar69 + 0x24) & 0x10) != 0)) {
          *(uint *)((long)RVar69 + 0x34) = *(uint *)((long)RVar69 + 0x34) & uVar72;
        }
        if (3 < bVar8) goto LAB_00127bdb;
        if (((uVar63 & 0x40008) == 0) &&
           (*(uint *)((ZoneAllocator *)((long)RStack_970 + 0x3c) + uVar55 * 4) != 0)) {
          *(uint *)((long)RVar69 + 0x38) =
               *(uint *)((long)RVar69 + 0x38) |
               *(uint *)((ZoneAllocator *)((long)RStack_970 + 0x3c) + uVar55 * 4);
        }
        RVar69._id = 0;
        RVar69._signature._bits = uStack_964;
        SVar35 = RVar37._signature._bits;
        RVar41._signature._bits._0_1_ = SVar35._bits < uStack_964;
        RVar58 = (RegOnly)((long)RVar58 + 0x20);
        RVar37._id = 0;
        RVar37._signature._bits = SVar35._bits + 1;
      } while (RStack_908._signature._bits._bits + SVar35._bits != 0);
      iVar11 = 0x47;
      this_01 = RStack_930;
      RVar58 = RStack_980;
    }
LAB_00127690:
    if ((char)RVar41._signature._bits == '\0') {
      if (*(char *)&((ZoneVectorBase *)((long)RVar62 + 0x10))->_data == '\x12') {
        lVar6 = *(long *)((long)RVar46 + 0x98);
        ZVar25 = *(ZoneAllocator *)((long)RVar62 + 0x85);
        if ((byte)*(ZoneAllocator *)((long)RVar62 + 0x85) < (byte)*(ZoneAllocator *)(lVar6 + 0x2db))
        {
          ZVar25 = *(ZoneAllocator *)(lVar6 + 0x2db);
        }
        *(ZoneAllocator *)(lVar6 + 0x2db) = ZVar25;
        if ((byte)ZVar25 < (byte)*(ZoneAllocator *)(lVar6 + 0x2dd)) {
          ZVar25 = *(ZoneAllocator *)(lVar6 + 0x2dd);
        }
        *(ZoneAllocator *)(lVar6 + 0x2dd) = ZVar25;
      }
      uVar63 = -(uint)((int)(*(uint *)RStack_928 ^ 0x80000000) < (int)(uVar10 ^ 0x80000000));
      uVar72 = -(uint)((int)(*(uint *)((long)RStack_928 + 4) ^ 0x80000000) <
                      (int)(uVar56 ^ 0x80000000));
      uVar73 = -(uint)((int)(*(uint *)((long)RStack_928 + 8) ^ 0x80000000) <
                      (int)(uVar26 ^ 0x80000000));
      uVar74 = -(uint)((int)(*(uint *)((long)RStack_928 + 0xc) ^ 0x80000000) <
                      (int)(uVar77 ^ 0x80000000));
      uVar10 = uVar10 & uVar63 | ~uVar63 & *(uint *)RStack_928;
      uVar56 = uVar56 & uVar72 | ~uVar72 & *(uint *)((long)RStack_928 + 4);
      uVar26 = uVar26 & uVar73 | ~uVar73 & *(uint *)((long)RStack_928 + 8);
      uVar77 = uVar77 & uVar74 | ~uVar74 & *(uint *)((long)RStack_928 + 0xc);
      RVar42._signature._bits = RVar42._signature._bits._bits + 2;
      RVar42._id = 0;
      iVar11 = 0;
    }
    if (iVar11 != 0) goto LAB_0012777b;
  }
  if (RVar62 == this_01) goto LAB_00127733;
  RVar62 = *(RegOnly *)((long)RVar62 + 8);
  RVar12 = RVar41;
  if (RVar62 == (RegOnly)0x0) goto LAB_00127c21;
  goto LAB_00127315;
LAB_00127733:
  *(uint *)(uStack_958 + 0x34) = uVar10;
  *(uint *)(uStack_958 + 0x38) = uVar56;
  *(uint *)(uStack_958 + 0x3c) = uVar26;
  *(uint *)(uStack_958 + 0x40) = uVar77;
  uVar63 = *(uint *)&((ZoneVectorBase *)((long)RVar46 + 0x1a0))->_data;
  uVar72 = *(uint *)((long)RVar46 + 0x1a4);
  uVar73 = -(uint)((int)(uVar10 ^ 0x80000000) < (int)(*(uint *)((long)RVar46 + 0x198) ^ 0x80000000))
  ;
  uVar74 = -(uint)((int)(uVar56 ^ 0x80000000) < (int)(*(uint *)((long)RVar46 + 0x19c) ^ 0x80000000))
  ;
  uVar75 = -(uint)((int)(uVar26 ^ 0x80000000) < (int)(uVar63 ^ 0x80000000));
  uVar76 = -(uint)((int)(uVar77 ^ 0x80000000) < (int)(uVar72 ^ 0x80000000));
  *(uint *)((long)RVar46 + 0x198) = ~uVar73 & uVar10 | *(uint *)((long)RVar46 + 0x198) & uVar73;
  *(uint *)((long)RVar46 + 0x19c) = ~uVar74 & uVar56 | *(uint *)((long)RVar46 + 0x19c) & uVar74;
  *(uint *)&((ZoneVectorBase *)((long)RVar46 + 0x1a0))->_data = ~uVar75 & uVar26 | uVar63 & uVar75;
  *(uint *)((long)RVar46 + 0x1a4) = ~uVar76 & uVar77 | uVar72 & uVar76;
  iVar11 = 0;
  if (RVar42._signature._bits._bits != *(uint32_t *)(uStack_958 + 0x24)) goto LAB_00127c67;
  goto LAB_0012777b;
LAB_0012684f:
  do {
    RVar60._id = 0;
    RVar60._signature._bits = *(uint *)((long)RVar58 + 0xd8);
    if (RVar60 == (RegOnly)0x0) break;
    uStack_658 = CONCAT44(iVar11 + 1,(undefined4)uStack_658);
    bVar70 = false;
    pBVar40 = pBVar38;
    do {
      unaff_R13 = (RegOnly)((long)RVar60 + -1);
      RVar31._id = 0;
      RVar31._signature._bits = *(uint *)((long)RVar58 + 0xd8);
      if ((ulong)RVar31 <= (ulong)unaff_R13) {
LAB_00126961:
        pBStack_660 = (BaseNode *)0x126966;
        buildCFGDominators();
        goto LAB_00126966;
      }
      RVar49 = *(RegOnly *)
                ((long)((ZoneVectorBase *)((long)RVar58 + 0xd0))->_data + (long)RVar60 * 8 + -8);
      pBVar38 = pBVar40;
      if (RVar49 != RVar12) {
        uVar55 = (ulong)*(uint *)((long)RVar49 + 0x60);
        if (uVar55 == 0) {
          pBVar38 = (BaseNode *)0x0;
        }
        else {
          uVar28 = uVar55;
          pBVar40 = (BaseNode *)0x0;
          do {
            uVar32 = uVar28 - 1;
            if (uVar55 <= uVar32) {
              pBStack_660 = (BaseNode *)0x126961;
              buildCFGDominators();
              goto LAB_00126961;
            }
            RVar47 = *(RegOnly *)((long)RVar49 + 0x58);
            pBVar39 = *(BaseNode **)((ZoneAllocator *)((long)RVar47 + -8) + uVar28 * 8);
            pBVar38 = pBVar40;
            if ((*(long *)(pBVar39 + 0x50) != 0) && (pBVar38 = pBVar39, pBVar40 != (BaseNode *)0x0))
            {
              while (pBVar38 = pBVar40, pBVar40 != pBVar39) {
                uVar10 = *(uint *)(pBVar39 + 0x2c);
                while( true ) {
                  uVar56 = *(uint *)(pBVar40 + 0x2c);
                  RVar47._id = 0;
                  RVar47._signature._bits = uVar56;
                  if (uVar10 <= uVar56) break;
                  pBVar40 = *(BaseNode **)(pBVar40 + 0x50);
                }
                while (uVar10 < uVar56) {
                  pBVar39 = *(BaseNode **)(pBVar39 + 0x50);
                  uVar10 = *(uint *)(pBVar39 + 0x2c);
                }
              }
            }
            uVar28 = uVar32;
            pBVar40 = pBVar38;
          } while (uVar32 != 0);
        }
        if (*(BaseNode **)((long)RVar49 + 0x50) != pBVar38) {
          if (RVar46 != (RegOnly)0x0) {
            pBStack_660 = (BaseNode *)0x12691a;
            RVar47 = RVar46;
            fVar71 = Logger::logf((Logger *)RVar46,fVar71);
          }
          *(BaseNode **)((long)RVar49 + 0x50) = pBVar38;
          bVar70 = true;
        }
      }
      pBVar40 = pBVar38;
      RVar60 = unaff_R13;
    } while (unaff_R13 != (RegOnly)0x0);
    iVar11 = uStack_658._4_4_;
  } while (bVar70);
  if (RVar46 != (RegOnly)0x0) {
    pBStack_660 = (BaseNode *)0x12694b;
    Logger::logf((Logger *)RVar46,fVar71);
  }
  return 0;
code_r0x00126e1d:
  RVar46 = *(RegOnly *)RVar46;
  if (RVar46 != (RegOnly)0x0) goto LAB_00126bd1;
  RStack_9b8._signature._bits = 0x127bcc;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127bcc:
  RStack_9b8._signature._bits = 0x127bd1;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127bd1:
  RStack_9b8._signature._bits = 0x127bd6;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127bd6:
  RStack_9b8._signature._bits = 0x127bdb;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127bdb:
  RStack_9b8._signature._bits = 0x127be0;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127be0:
  RStack_9b8._signature._bits = 0x127be5;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127be5:
  RStack_9b8._signature._bits = 0x127bea;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127bea:
  RStack_9b8._signature._bits = 0x127bef;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127bef:
  RVar42 = RVar41;
  RStack_9b8._signature._bits = 0x127bf4;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127bf4:
  RStack_9b8._signature._bits = 0x127bf9;
  RStack_9b8._id = 0;
  buildLiveness();
  RVar46 = RVar37;
LAB_00127bf9:
  RVar37 = RVar46;
  RStack_9b8._signature._bits = 0x127bfe;
  RStack_9b8._id = 0;
  buildLiveness();
  RVar12 = RVar42;
LAB_00127bfe:
  RVar41 = RVar12;
  RStack_9b8._signature._bits = 0x127c03;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c03:
  RStack_9b8._signature._bits = 0x127c08;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c08:
  RStack_9b8._signature._bits = 0x127c0d;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c0d:
  RStack_9b8._signature._bits = 0x127c12;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c12:
  RStack_9b8._signature._bits = 0x127c17;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c17:
  RStack_9b8._signature._bits = 0x127c1c;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c1c:
  RStack_9b8._signature._bits = 0x127c21;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c21:
  RStack_9b8._signature._bits = 0x127c26;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c26:
  RStack_9b8._signature._bits = 0x127c2b;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c2b:
  RStack_9b8._signature._bits = 0x127c30;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c30:
  RStack_9b8._signature._bits = 0x127c35;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c35:
  RStack_9b8._signature._bits = 0x127c3a;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c3a:
  RStack_9b8._signature._bits = 0x127c3f;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c3f:
  RStack_9b8._signature._bits = 0x127c44;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c44:
  RStack_9b8._signature._bits = 0x127c49;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c49:
  RStack_9b8._signature._bits = 0x127c4e;
  RStack_9b8._id = 0;
  buildLiveness();
  RVar46 = RVar41;
  RVar67 = RVar66;
LAB_00127c4e:
  RVar41 = RVar46;
  RStack_9b8._signature._bits = 0x127c53;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c53:
  RStack_9b8._signature._bits = 0x127c58;
  RStack_9b8._id = 0;
  buildLiveness();
  RVar12 = RVar41;
  RVar66 = RVar67;
LAB_00127c58:
  RStack_9b8._signature._bits = 0x127c5d;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c5d:
  RStack_9b8._signature._bits = 0x127c62;
  RStack_9b8._id = 0;
  buildLiveness();
  RVar41 = RVar12;
LAB_00127c62:
  RStack_9b8._signature._bits = 0x127c67;
  RStack_9b8._id = 0;
  buildLiveness();
LAB_00127c67:
  RStack_9b8 = (RegOnly)assignArgIndexToWorkRegs;
  buildLiveness();
  RVar43 = RVar41;
  RVar59 = RVar58;
  RStack_9e0 = RVar37;
  RStack_9d8 = RVar58;
  RStack_9d0 = RVar62;
  RStack_9c8 = RVar66;
  RStack_9c0 = RVar69;
  RStack_9b8 = RVar41;
  if (*(int *)((long)this_01 + 0xb8) == 0) {
LAB_00127de7:
    RStack_a00 = (RegOnly)annotateCode;
    assignArgIndexToWorkRegs();
    auStack_e50._24_8_ = auStack_e30;
    auStack_e50._8_8_ = (BaseBuilder *)0x0;
    auStack_e50._0_8_ = (_func_int **)0x20;
    auStack_e50._16_8_ = (char *)0x407;
    auStack_e30[0] = 0;
    plVar29 = (long *)((ZoneVectorBase *)((long)this_01 + 0xb0))->_data;
    plVar4 = plVar29 + *(uint *)((long)this_01 + 0xb8);
    RStack_a28 = RVar37;
    RStack_a20 = RVar59;
    RStack_a18 = RVar62;
    RStack_a10 = RVar66;
    RStack_a08 = RVar69;
    RStack_a00 = RVar43;
    do {
      if (plVar29 == plVar4) {
        String::reset((String *)auStack_e50);
        return 0;
      }
      pBVar38 = *(BaseNode **)(*plVar29 + 0x10);
      if (pBVar38 != (BaseNode *)0x0) {
        pBVar40 = *(BaseNode **)(*plVar29 + 0x18);
        while( true ) {
          String::clear((String *)auStack_e50);
          Formatter::formatNode
                    ((String *)auStack_e50,(FormatOptions *)((long)this_01 + 0x88),
                     *(BaseBuilder **)((long)this_01 + 8),pBVar38);
          if ((((((byte)*(ZoneAllocator *)((long)this_01 + 0x95) & 2) != 0) &&
               (((byte)pBVar38[0x11] & 0x20) != 0)) &&
              (lVar6 = *(long *)(pBVar38 + 0x20), lVar6 != 0)) && (*(int *)(lVar6 + 0x10) != 0)) {
            String::padEnd((String *)auStack_e50,0x28,' ');
            pBVar48 = (BaseRAPass *)auStack_e50;
            String::_opString((String *)auStack_e50,kAppend," | ",0xffffffffffffffff);
            uVar10 = *(uint *)(lVar6 + 0x10);
            if ((ulong)uVar10 != 0) {
              lVar64 = 0;
              do {
                if (lVar64 != 0) {
                  pBVar48 = (BaseRAPass *)auStack_e50;
                  String::_opChar((String *)auStack_e50,kAppend,' ');
                }
                uVar56 = *(uint *)(lVar6 + 0x4c + lVar64);
                if (*(uint *)((long)this_01 + 0x148) <= uVar56) {
                  annotateCode();
                  EVar9 = initGlobalLiveSpans(pBVar48);
                  if (EVar9 != 0) {
                    return EVar9;
                  }
                  group = k0;
                  do {
                    EVar9 = binPack(pBVar48,group);
                    if (EVar9 != 0) {
                      return EVar9;
                    }
                    group = group + kVec;
                  } while (group != kPC);
                  return 0;
                }
                lVar54 = *(long *)(*(long *)((long)((ZoneVectorBase *)((long)this_01 + 0x140))->
                                                   _data + (ulong)uVar56 * 8) + 8);
                if (*(uint *)(lVar54 + 0x18) < 0xc) {
                  lVar54 = lVar54 + 0x1c;
                }
                else {
                  lVar54 = *(long *)(lVar54 + 0x20);
                }
                String::_opFormat((String *)auStack_e50,kAppend,"%s{",lVar54);
                uVar56 = *(uint *)(lVar6 + 0x54 + lVar64);
                c = 'X';
                if ((((~uVar56 & 3) != 0) && (c = 'R', (uVar56 & 1) == 0)) &&
                   (c = 'W', (uVar56 & 2) == 0)) {
                  c = '?';
                }
                String::_opChar((String *)auStack_e50,kAppend,c);
                uVar56 = *(uint *)(lVar6 + 0x54 + lVar64);
                if ((uVar56 >> 0xc & 1) != 0) {
                  String::_opFormat((String *)auStack_e50,kAppend,"|Lead[%u]",
                                    (ulong)((uVar56 >> 0xd & 3) + 1));
                }
                if (*(char *)(lVar6 + 0x5a + lVar64) == -1) {
                  if ((*(byte *)(lVar6 + 0x54 + lVar64) & 4) != 0) {
                    String::_opString((String *)auStack_e50,kAppend,"|Use",0xffffffffffffffff);
                  }
                }
                else {
                  String::_opFormat((String *)auStack_e50,kAppend,"|Use=%u");
                }
                uVar56 = *(uint *)(lVar6 + 0x54 + lVar64);
                if ((uVar56 & 0x1400) == 0x400) {
                  String::_opFormat((String *)auStack_e50,kAppend,"+%u",(ulong)(uVar56 >> 0xd & 3));
                }
                if (*(char *)(lVar6 + 0x5b + lVar64) == -1) {
                  if ((*(byte *)(lVar6 + 0x54 + lVar64) & 8) != 0) {
                    String::_opString((String *)auStack_e50,kAppend,"|Out",0xffffffffffffffff);
                  }
                }
                else {
                  String::_opFormat((String *)auStack_e50,kAppend,"|Out=%u");
                }
                uVar56 = *(uint *)(lVar6 + 0x54 + lVar64);
                if ((uVar56 & 0x1800) == 0x800) {
                  String::_opFormat((String *)auStack_e50,kAppend,"+%u",(ulong)(uVar56 >> 0xd & 3));
                }
                if ((*(byte *)(lVar6 + 0x56 + lVar64) & 2) != 0) {
                  String::_opString((String *)auStack_e50,kAppend,"|Last",0xffffffffffffffff);
                }
                if ((*(byte *)(lVar6 + 0x56 + lVar64) & 4) != 0) {
                  String::_opString((String *)auStack_e50,kAppend,"|Kill",0xffffffffffffffff);
                }
                pBVar48 = (BaseRAPass *)auStack_e50;
                String::_opString((String *)auStack_e50,kAppend,"}",0xffffffffffffffff);
                lVar64 = lVar64 + 0x20;
              } while ((ulong)uVar10 << 5 != lVar64);
            }
          }
          iVar11 = (int)auStack_e50 + 1;
          if (0x1e < (byte)auStack_e50[0]) {
            iVar11 = (int)auStack_e50._24_8_;
          }
          iVar11 = Zone::dup((Zone *)(*(long *)((long)this_01 + 8) + 0xb8),iVar11);
          *(ulong *)(pBVar38 + 0x28) = CONCAT44(extraout_var,iVar11);
          if (pBVar38 == pBVar40) break;
          pBVar38 = *(BaseNode **)(pBVar38 + 8);
        }
      }
      plVar29 = plVar29 + 1;
    } while( true );
  }
  lVar6 = *(long *)((long)this_01 + 0x98);
  uStack_9e8 = (ulong)*(byte *)(lVar6 + 0xa8);
  if (uStack_9e8 != 0) {
    lVar54 = *((ZoneVectorBase *)((long)this_01 + 0xb0))->_data;
    uStack_9f0 = (ulong)*(byte *)(lVar6 + 0xa8);
    lVar64 = lVar6 + 0xd0;
    lVar53 = 4;
    uVar55 = 0;
    do {
      if (uVar55 == uStack_9f0) {
LAB_00127de2:
        RStack_a00._signature._bits = 0x127de7;
        RStack_a00._id = 0;
        assignArgIndexToWorkRegs();
        goto LAB_00127de7;
      }
      RVar37 = *(RegOnly *)((long)this_01 + 8);
      RVar66 = (RegOnly)((ZoneVectorBase *)((long)this_01 + 0x100))->_data;
      RVar69 = (RegOnly)(*(long *)(lVar6 + 0x348) + lVar53);
      RVar59._signature._bits = 0;
      RVar59._id = 0;
      do {
        if (*(int *)((ZoneAllocator *)((long)RVar69 + -4) + (long)RVar59 * 8) != 0) {
          RVar43._signature._bits = *(int *)((long)RVar69 + (long)RVar59 * 8) - 0x100;
          RVar43._id = 0;
          if (RVar43._signature._bits < *(uint *)&((ZoneVectorBase *)((long)RVar37 + 0x1f0))->_data)
          {
            if (*(uint *)&((ZoneVectorBase *)((long)RVar37 + 0x1f0))->_data <=
                RVar43._signature._bits) {
              RStack_a00._signature._bits = 0x127dd3;
              RStack_a00._id = 0;
              assignArgIndexToWorkRegs();
LAB_00127dd3:
              RStack_a00._signature._bits = 0x127dd8;
              RStack_a00._id = 0;
              assignArgIndexToWorkRegs();
LAB_00127dd8:
              RStack_a00._signature._bits = 0x127ddd;
              RStack_a00._id = 0;
              assignArgIndexToWorkRegs();
LAB_00127ddd:
              RStack_a00._signature._bits = 0x127de2;
              RStack_a00._id = 0;
              assignArgIndexToWorkRegs();
              goto LAB_00127de2;
            }
            uVar28 = (ulong)RVar43._signature._bits;
            RVar43 = *(RegOnly *)((long)RVar37 + 0x1e8);
            RVar62 = *(RegOnly *)((long)RVar43 + uVar28 * 8);
            if ((RVar62 != (RegOnly)0x0) &&
               (RVar62 = *(RegOnly *)((long)RVar62 + 0x28), RVar62 != (RegOnly)0x0)) {
              uVar10 = *(uint *)RVar62;
              if (*(uint *)(lVar54 + 0x80) <= uVar10) goto LAB_00127dd3;
              RVar43._signature._bits = uVar10 >> 6;
              RVar43._id = 0;
              if ((*(ulong *)(*(long *)(lVar54 + 0x78) + (long)RVar43 * 8) >> ((ulong)uVar10 & 0x3f)
                  & 1) == 0) goto LAB_00127d9a;
              *(ZoneAllocator *)((long)RVar62 + 0x48) = SUB81(uVar55,0);
              *(ZoneAllocator *)((long)RVar62 + 0x49) = RVar59._signature._bits._0_1_;
              if (0x1f < uVar55) goto LAB_00127dd8;
              uVar10 = *(uint *)(lVar64 + (long)RVar59 * 4);
              RVar43._id = 0;
              RVar43._signature._bits = uVar10;
              if ((uVar10 >> 8 & 1) != 0) {
                if (0x1fffffff < uVar10) goto LAB_00127ddd;
                if (((*(uint *)&((ZoneVectorBase *)((long)RVar62 + 0x20))->_data ^
                     *(uint *)((ZoneAllocator *)((long)RVar66 + 0x14) + (ulong)(uVar10 >> 0x18) * 4)
                     ) & 0xf00) == 0) {
                  RVar43._signature._bits = uVar10 >> 0x10;
                  RVar43._id = 0;
                  *(ZoneAllocator *)((long)RVar62 + 0x4b) = SUB41(uVar10 >> 0x10,0);
                }
              }
            }
          }
        }
LAB_00127d9a:
        RVar59 = (RegOnly)((long)RVar59 + 1);
      } while (RVar59 != (RegOnly)0x4);
      uVar55 = uVar55 + 1;
      lVar53 = lVar53 + 0x20;
      lVar64 = lVar64 + 0x10;
    } while (uVar55 != uStack_9e8);
  }
  return 0;
LAB_00126966:
  pBStack_660 = (BaseNode *)0x12696b;
  buildCFGDominators();
  pBStack_660 = pBVar40;
  RStack_668 = RVar49;
  RStack_670 = RVar58;
  RStack_678 = unaff_R13;
  RStack_680 = RVar12;
  RStack_688 = RVar46;
  if ((*(uint *)((long)RVar47 + 0x94) >> 9 & 1) == 0) {
    RVar58._signature._bits = 0;
    RVar58._id = 0;
  }
  else {
    RVar58 = (RegOnly)((ZoneVectorBase *)((long)RVar47 + 0x80))->_data;
  }
  fVar71 = 0.0;
  auStack_8af = SUB1615((undefined1  [16])0x0,1);
  SStack_8b0 = (String)0x20;
  puStack_898 = auStack_890;
  uStack_8a0 = 0x207;
  auStack_890[0] = 0;
  RStack_9a0 = RVar47;
  if (RVar58 != (RegOnly)0x0) {
    RStack_9b8._signature._bits = 0x1269da;
    RStack_9b8._id = 0;
    fVar71 = Logger::logf((Logger *)RVar58,0.0);
  }
  uVar10 = *(uint *)((long)RStack_9a0 + 0x148);
  RVar66._id = 0;
  RVar66._signature._bits = uVar10;
  if (uVar10 != 0) {
    RVar69._id = 0;
    RVar69._signature._bits = *(uint *)((long)RStack_9a0 + 0xb8);
    RVar41._id = 0;
    RVar41._signature._bits = *(uint *)((long)RStack_9a0 + 0xd8);
    ZStack_8d0._data = (void *)0x0;
    ZStack_8d0._size = 0;
    ZStack_8d0._capacity = 0;
    ZStack_8e0._data = (void *)0x0;
    ZStack_8e0._size = 0;
    ZStack_8e0._capacity = 0;
    auStack_8f0 = (undefined1  [16])0x0;
    RVar46 = (RegOnly)((long)RStack_9a0 + 0x18);
    RStack_9b8._signature._bits = 0x126a32;
    RStack_9b8._id = 0;
    EVar9 = ZoneVectorBase::_resize(&ZStack_8d0,(ZoneAllocator *)RVar46,4,uVar10);
    RVar62._id = 0;
    RVar62._signature._bits = EVar9;
    RVar61 = RVar62;
    if (EVar9 != 0) goto LAB_00127ba5;
    RStack_9b8._signature._bits = 0x126a5f;
    RStack_9b8._id = 0;
    RStack_998 = RVar41;
    RStack_960 = RVar69;
    EVar9 = ZoneVectorBase::_resize(&ZStack_8e0,(ZoneAllocator *)RVar46,4,uVar10);
    if (EVar9 != 0) {
      RVar61._id = 0;
      RVar61._signature._bits = EVar9;
      goto LAB_00127ba5;
    }
    this_01 = (RegOnly)auStack_8f0;
    RStack_9b8._signature._bits = 0x126a85;
    RStack_9b8._id = 0;
    EVar9 = ZoneVectorBase::_resize
                      ((ZoneVectorBase *)this_01,(ZoneAllocator *)RVar46,4,
                       RStack_960._signature._bits._bits);
    RVar37 = RVar62;
    if (EVar9 != 0) {
      RVar37._id = 0;
      RVar37._signature._bits = EVar9;
    }
    SVar35 = RVar37._signature._bits;
    if (EVar9 != 0) {
LAB_00126a90:
      RVar61._id = 0;
      RVar61._signature._bits = SVar35._bits;
      goto LAB_00127ba5;
    }
    RStack_988 = RVar46;
    RStack_980 = RVar58;
    RStack_978 = RVar66;
    if (RStack_998._signature._bits != 0) {
      RVar27._signature._bits = 0;
      RVar27._id = 0;
      RVar12 = RStack_9a0;
      do {
        RVar14._id = 0;
        RVar14._signature._bits = *(uint *)((long)RVar12 + 0xd8);
        RVar42 = RVar41;
        if ((ulong)RVar14 <= (ulong)RVar27) goto LAB_00127bf9;
        RStack_970 = *(RegOnly *)
                      ((long)((ZoneVectorBase *)((long)RVar12 + 0xd0))->_data + (long)RVar27 * 8);
        this_01 = (RegOnly)((long)RStack_970 + 0x78);
        SVar35 = RVar66._signature._bits;
        RStack_9b8._signature._bits = 0x126b1f;
        RStack_9b8._id = 0;
        RStack_930 = RVar27;
        EVar9 = ZoneBitVector::_resize
                          ((ZoneBitVector *)this_01,(ZoneAllocator *)(*(long *)RStack_970 + 0x18),
                           SVar35._bits,SVar35._bits,false);
        RVar46 = RStack_970;
        RVar50._id = 0;
        RVar50._signature._bits = EVar9;
        if (EVar9 == 0) {
          this_01 = (RegOnly)((long)RStack_970 + 0x88);
          RStack_9b8._signature._bits = 0x126b47;
          RStack_9b8._id = 0;
          EVar9 = ZoneBitVector::_resize
                            ((ZoneBitVector *)this_01,(ZoneAllocator *)(*(long *)RStack_970 + 0x18),
                             SVar35._bits,SVar35._bits,false);
          RVar69 = RVar46;
          if (EVar9 == 0) {
            this_01 = (RegOnly)((long)RVar46 + 0x98);
            RStack_9b8._signature._bits = 0x126b6b;
            RStack_9b8._id = 0;
            EVar9 = ZoneBitVector::_resize
                              ((ZoneBitVector *)this_01,(ZoneAllocator *)(*(long *)RVar46 + 0x18),
                               SVar35._bits,SVar35._bits,false);
            if (EVar9 == 0) {
              this_01 = (RegOnly)((long)RStack_970 + 0xa8);
              RStack_9b8._signature._bits = 0x126b94;
              RStack_9b8._id = 0;
              EVar9 = ZoneBitVector::_resize
                                ((ZoneBitVector *)this_01,
                                 (ZoneAllocator *)(*(long *)RStack_970 + 0x18),SVar35._bits,
                                 SVar35._bits,false);
              RVar50._id = 0;
              RVar50._signature._bits = EVar9;
            }
            else {
              RVar50._id = 0;
              RVar50._signature._bits = EVar9;
            }
          }
          else {
            RVar50._id = 0;
            RVar50._signature._bits = EVar9;
          }
        }
        bVar70 = false;
        RVar12 = RStack_9a0;
        RVar62 = RVar50;
        if (RVar50._signature._bits._bits == 0) {
          uStack_958 = uStack_958 & 0xffffffff00000000;
          RStack_928 = (RegOnly)((ZoneVectorBase *)((long)RStack_970 + 0x10))->_data;
          RVar46 = *(RegOnly *)((long)RStack_970 + 0x18);
          RVar50 = RVar37;
          RVar49 = RStack_970;
LAB_00126bd1:
          if (((byte)*(ZoneAllocator *)((long)RVar46 + 0x11) & 0x20) != 0) {
            RVar66 = *(RegOnly *)((long)RVar46 + 0x20);
            if (RVar66 == (RegOnly)0x0) goto LAB_00127bcc;
            uVar10 = *(uint *)&((ZoneVectorBase *)((long)RVar66 + 0x10))->_data;
            RVar69._id = 0;
            RVar69._signature._bits = uVar10;
            uStack_9a4 = CONCAT31(uStack_9a4._1_3_,uVar10 == 0);
            if (uVar10 != 0) {
              RStack_920._signature._bits = -uVar10;
              RStack_920._id = 0;
              RVar66 = (RegOnly)((long)RVar66 + 0x54);
              RVar58._signature._bits = 1;
              RVar58._id = 0;
              uStack_964 = uVar10;
              RStack_910 = RVar46;
              do {
                uVar10 = *(uint *)((long)RVar66 + -8);
                RVar62._id = 0;
                RVar62._signature._bits = uVar10;
                if (ZStack_8d0._size <= uVar10) {
                  RStack_9b8._signature._bits = 0x127a44;
                  RStack_9b8._id = 0;
                  buildLiveness();
LAB_00127a44:
                  RStack_9b8._signature._bits = 0x127a49;
                  RStack_9b8._id = 0;
                  buildLiveness();
LAB_00127a49:
                  RStack_9b8._signature._bits = 0x127a4e;
                  RStack_9b8._id = 0;
                  buildLiveness();
                  goto LAB_00127a4e;
                }
                piVar2 = (int *)((long)ZStack_8d0._data + (long)RVar62 * 4);
                *piVar2 = *piVar2 + 1;
                if (ZStack_8e0._size <= uVar10) goto LAB_00127a44;
                uVar56 = *(uint *)RVar66;
                piVar2 = (int *)((long)ZStack_8e0._data + (long)RVar62 * 4);
                *piVar2 = *piVar2 + (uint)((uVar56 >> 1 & 1) != 0);
                if (*(uint *)&((ZoneVectorBase *)((long)RVar49 + 0xb0))->_data <= uVar10)
                goto LAB_00127a49;
                lVar6 = *(long *)((long)RVar49 + 0xa8);
                RVar41 = (RegOnly)(1L << ((byte)uVar10 & 0x3f));
                RVar37._id = 0;
                RVar37._signature._bits = uVar10 >> 6;
                uVar55 = *(ulong *)(lVar6 + (long)RVar37 * 8);
                uVar26 = 0x40000;
                if ((uVar55 >> ((ulong)RVar62 & 0x3f) & 1) == 0) {
                  if (uVar10 < *(uint *)&((ZoneVectorBase *)((long)RVar49 + 0xa0))->_data) {
                    if ((*(ulong *)(*(long *)((long)RVar49 + 0x98) + (long)RVar37 * 8) &
                        (ulong)RVar41) == 0) {
                      uVar26 = 0x20000;
                      goto LAB_00126c93;
                    }
                    goto LAB_00126cb8;
                  }
LAB_00127b52:
                  RStack_9b8._signature._bits = 0x127b57;
                  RStack_9b8._id = 0;
                  buildLiveness();
                  goto LAB_00127b57;
                }
LAB_00126c93:
                *(uint *)RVar66 = uVar56 | uVar26;
LAB_00126cb8:
                puVar33 = (ulong *)(lVar6 + (long)RVar37 * 8);
                uVar56 = *(uint *)RVar66;
                if ((uVar56 & 3) != 2) {
                  *puVar33 = uVar55 & ~(ulong)RVar41;
                  if (uVar10 < *(uint *)&((ZoneVectorBase *)((long)RVar49 + 0xa0))->_data) {
                    puVar33 = (ulong *)(*(long *)((long)RVar49 + 0x98) + (long)RVar37 * 8);
                    uVar55 = *puVar33;
                    goto LAB_00126cf0;
                  }
LAB_00127b43:
                  RStack_9b8._signature._bits = 0x127b48;
                  RStack_9b8._id = 0;
                  buildLiveness();
LAB_00127b48:
                  RStack_9b8._signature._bits = 0x127b4d;
                  RStack_9b8._id = 0;
                  buildLiveness();
LAB_00127b4d:
                  RStack_9b8._signature._bits = 0x127b52;
                  RStack_9b8._id = 0;
                  buildLiveness();
                  goto LAB_00127b52;
                }
LAB_00126cf0:
                *puVar33 = uVar55 | (ulong)RVar41;
                if ((uVar56 >> 0xc & 1) != 0) {
                  if (uVar10 < *(uint *)((long)RVar12 + 0x148)) {
                    puVar1 = (uint *)(*(long *)((long)((ZoneVectorBase *)((long)RVar12 + 0x140))->
                                                      _data + (long)RVar62 * 8) + 0x24);
                    *puVar1 = *puVar1 | 0x10;
                    goto LAB_00126d18;
                  }
                  goto LAB_00127b48;
                }
LAB_00126d18:
                uVar56 = *(uint *)((long)RVar66 + -4);
                if ((ulong)uVar56 != 0xffffffff) {
                  if (*(uint *)((long)RVar12 + 0x148) <= uVar56) {
                    RStack_9b8._signature._bits = 0x127b43;
                    RStack_9b8._id = 0;
                    buildLiveness();
                    goto LAB_00127b43;
                  }
                  RVar69 = *(RegOnly *)
                            ((long)((ZoneVectorBase *)((long)RVar12 + 0x140))->_data +
                            (ulong)uVar56 * 8);
                  this_01 = (RegOnly)((long)RVar69 + 0x90);
                  if (*(uint *)((long)RVar69 + 0x98) <= uVar10) {
                    uStack_98c = (uint)RVar50._signature._bits;
                    RStack_9b8._signature._bits = 0x126d72;
                    RStack_9b8._id = 0;
                    RStack_908 = this_01;
                    uVar56 = ZoneBitVector::_resize
                                       ((ZoneBitVector *)this_01,(ZoneAllocator *)RStack_988,
                                        uVar10 + 1,uVar10 + 1,false);
                    RVar50._id = 0;
                    RVar50._signature._bits = uStack_98c;
                    this_01 = RStack_908;
                    RVar12 = RStack_9a0;
                    RVar49 = RStack_970;
                    RVar46 = RStack_910;
                    if (uVar56 == 0) goto LAB_00126d95;
LAB_00126dab:
                    bVar70 = uVar56 == 0;
                    if (!bVar70) {
                      RVar50._id = 0;
                      RVar50._signature._bits = uVar56;
                    }
                    RVar69._id = 0;
                    RVar69._signature._bits = uStack_964;
                    goto LAB_00126dbd;
                  }
LAB_00126d95:
                  if (uVar10 < *(uint *)((long)RVar69 + 0x98)) {
                    puVar33 = (ulong *)(*(long *)this_01 + (long)RVar37 * 8);
                    *puVar33 = *puVar33 | (ulong)RVar41;
                    uVar56 = 0;
                    goto LAB_00126dab;
                  }
                  goto LAB_00127b4d;
                }
                bVar70 = true;
LAB_00126dbd:
                if (!bVar70) break;
                SVar35 = RVar58._signature._bits;
                uStack_9a4 = CONCAT31(uStack_9a4._1_3_,RVar69._signature._bits._bits <= SVar35._bits
                                     );
                RVar66 = (RegOnly)((long)RVar66 + 0x20);
                RVar58._id = 0;
                RVar58._signature._bits = SVar35._bits + 1;
              } while (RStack_920._signature._bits._bits + SVar35._bits != 0);
            }
            RVar58 = RStack_980;
            RVar66 = RStack_978;
            if ((uStack_9a4 & 1) != 0) {
              uStack_958 = CONCAT44(uStack_958._4_4_,(int)uStack_958 + (uStack_9a4 & 1));
              goto LAB_00126e13;
            }
            bVar70 = false;
            goto LAB_00126e5e;
          }
LAB_00126e13:
          if (RVar46 != RStack_928) goto code_r0x00126e1d;
          if ((uint)auStack_8f0._8_4_ <= *(uint *)((long)RVar49 + 8)) goto LAB_00127c49;
          *(int *)(auStack_8f0._0_8_ + (ulong)*(uint *)((long)RVar49 + 8) * 4) = (int)uStack_958;
          bVar70 = true;
        }
LAB_00126e5e:
        SVar35 = RVar50._signature._bits;
        if (!bVar70) goto LAB_00126a90;
        RVar27 = (RegOnly)((long)RStack_930 + 1);
        RVar46 = RVar37;
        RVar37 = RVar50;
      } while (RVar27 != RStack_998);
    }
    RVar37 = RStack_988;
    ZStack_950.super_ZoneStackBase = (ZoneStackBase)0x0;
    ZStack_950._1_8_ = 0;
    ZStack_950._9_7_ = 0;
    ZStack_950._16_8_ = 0;
    auStack_900 = (undefined1  [16])0x0;
    RStack_9b8._signature._bits = 0x126eaf;
    RStack_9b8._id = 0;
    EVar9 = ZoneStackBase::_init(&ZStack_950.super_ZoneStackBase,(ZoneAllocator *)RStack_988,0x110);
    if (EVar9 != 0) {
      SVar35._bits = EVar9;
    }
    RVar52._id = 0;
    RVar52._signature._bits = SVar35._bits;
    RVar62 = RVar52;
    if (EVar9 == 0) {
      this_01 = (RegOnly)auStack_900;
      RStack_9b8._signature._bits = 0x126eda;
      RStack_9b8._id = 0;
      EVar9 = ZoneBitVector::_resize
                        ((ZoneBitVector *)this_01,(ZoneAllocator *)RVar37,
                         *(uint32_t *)((long)RStack_9a0 + 0xb8),
                         *(uint32_t *)((long)RStack_9a0 + 0xb8),true);
      RVar67 = RStack_998;
      if (EVar9 == 0) {
        RVar69._signature._bits = RVar66._signature._bits._bits + 0x3f >> 6;
        RVar69._id = 0;
        uVar10 = RVar69._signature._bits;
        if (RStack_998._signature._bits._bits != 0) {
          RVar37._signature._bits = 0;
          RVar37._id = 0;
          RVar46 = RVar41;
          RVar41 = RVar52;
          do {
            RVar22._id = 0;
            RVar22._signature._bits = *(uint *)((long)RStack_9a0 + 0xd8);
            if ((ulong)RVar22 <= (ulong)RVar37) goto LAB_00127c4e;
            RVar62 = *(RegOnly *)
                      ((long)((ZoneVectorBase *)((long)RStack_9a0 + 0xd0))->_data + (long)RVar37 * 8
                      );
            RStack_9b8._signature._bits = 0x127809;
            RStack_9b8._id = 0;
            this_01 = RVar62;
            LiveOps::recalcInOut((RABlock *)RVar62,RVar69._signature._bits,true);
            if (ZStack_950._0_8_ == 0) goto LAB_00127c53;
            if (ZStack_950._16_8_ + 0x1f8 < *(ulong *)(ZStack_950._16_8_ + 0x18)) {
              this_01 = (RegOnly)&ZStack_950;
              RStack_9b8._signature._bits = 0x12783b;
              RStack_9b8._id = 0;
              uVar10 = ZoneStackBase::_prepareBlock((ZoneStackBase *)this_01,1,0x20);
              if (uVar10 == 0) goto LAB_0012784c;
            }
            else {
LAB_0012784c:
              pRVar5 = *(RegOnly **)(ZStack_950._16_8_ + 0x18);
              RVar66 = RVar67;
              if ((pRVar5 < (RegOnly *)(ZStack_950._16_8_ + 0x20)) ||
                 ((RegOnly *)(ZStack_950._16_8_ + 0x1f8) < pRVar5)) goto LAB_00127c44;
              *pRVar5 = RVar62;
              *(RegOnly **)(ZStack_950._16_8_ + 0x18) = pRVar5 + 1;
              uVar10 = 0;
            }
            RVar52 = RVar41;
            if (uVar10 != 0) {
              RVar52._id = 0;
              RVar52._signature._bits = uVar10;
            }
            SVar35 = RVar52._signature._bits;
            if (uVar10 != 0) goto LAB_00127a35;
            RVar37 = (RegOnly)((long)RVar37 + 1);
            RVar46 = RVar41;
            RVar41 = RVar52;
            uVar10 = RVar69._signature._bits;
          } while (RVar67 != RVar37);
        }
        do {
          uStack_9a4 = uVar10;
          RVar12 = (RegOnly)auStack_900;
          RVar66 = RVar67;
          if (ZStack_950._0_8_ == 0) goto LAB_00127c58;
          RVar62 = RVar52;
          if (*(long *)(ZStack_950._8_8_ + 0x10) == *(long *)(ZStack_950._16_8_ + 0x18))
          goto LAB_00127b57;
          RStack_9b8._signature._bits = 0x1278d8;
          RStack_9b8._id = 0;
          RVar37 = (RegOnly)ZoneStack<asmjit::v1_14::RABlock_*>::popFirst(&ZStack_950);
          RStack_9b8._signature._bits = 0x1278e8;
          RStack_9b8._id = 0;
          ZoneBitVector::setBit((ZoneBitVector *)RVar12,*(uint32_t *)((long)RVar37 + 8),false);
          RStack_9b8._signature._bits = 0x1278f5;
          RStack_9b8._id = 0;
          this_01 = RVar37;
          bVar70 = LiveOps::recalcInOut((RABlock *)RVar37,RVar69._signature._bits._bits,false);
          if (bVar70) {
            uVar10 = *(uint *)&((ZoneVectorBase *)((long)RVar37 + 0x60))->_data;
            RVar66._id = 0;
            RVar66._signature._bits = uVar10;
            RVar41._1_7_ = RVar12._1_7_;
            RVar41._signature._bits._0_1_ = RVar66 != (RegOnly)0x0;
            RStack_998 = RVar67;
            if (RVar66 != (RegOnly)0x0) {
              RVar69._signature._bits = 0;
              RVar69._id = 0;
              do {
                if (*(uint *)&((ZoneVectorBase *)((long)RVar37 + 0x60))->_data <=
                    RVar69._signature._bits._bits) goto LAB_00127c08;
                RVar58 = *(RegOnly *)((long)*(RegOnly *)((long)RVar37 + 0x58) + (long)RVar69 * 8);
                uVar56 = *(uint *)((long)RVar58 + 8);
                if ((uint)auStack_900._8_4_ <= uVar56) goto LAB_00127c0d;
                this_01 = (RegOnly)(1L << ((byte)uVar56 & 0x3f));
                uVar55 = *(ulong *)(auStack_900._0_8_ + (ulong)(uVar56 >> 6) * 8);
                bVar70 = true;
                if ((uVar55 >> ((ulong)uVar56 & 0x3f) & 1) == 0) {
                  *(ulong *)(auStack_900._0_8_ + (ulong)(uVar56 >> 6) * 8) = uVar55 | (ulong)this_01
                  ;
                  if (ZStack_950._0_8_ == 0) goto LAB_00127c35;
                  if (ZStack_950._16_8_ + 0x1f8 < *(ulong *)(ZStack_950._16_8_ + 0x18)) {
                    this_01 = (RegOnly)&ZStack_950;
                    RStack_9b8._signature._bits = 0x12799f;
                    RStack_9b8._id = 0;
                    RVar23._signature._bits =
                         ZoneStackBase::_prepareBlock((ZoneStackBase *)this_01,1,0x20);
                    RVar23._id = 0;
                    RVar62 = RVar52;
                    if (RVar23._signature._bits == 0) goto LAB_001279ab;
                  }
                  else {
LAB_001279ab:
                    pRVar5 = *(RegOnly **)(ZStack_950._16_8_ + 0x18);
                    if ((pRVar5 < (RegOnly *)(ZStack_950._16_8_ + 0x20)) ||
                       ((RegOnly *)(ZStack_950._16_8_ + 0x1f8) < pRVar5)) goto LAB_00127c26;
                    *pRVar5 = RVar58;
                    *(RegOnly **)(ZStack_950._16_8_ + 0x18) = pRVar5 + 1;
                    RVar23._signature._bits = 0;
                    RVar23._id = 0;
                  }
                  bVar70 = RVar23._signature._bits._bits == 0;
                  if (!bVar70) {
                    RVar52 = RVar23;
                  }
                }
                RVar58 = RStack_980;
                if (!bVar70) {
                  bVar70 = true;
                  RVar69._id = 0;
                  RVar69._signature._bits = uStack_9a4;
                  goto LAB_00127a15;
                }
                RVar69 = (RegOnly)((long)RVar69 + 1);
                RVar41._signature._bits._0_1_ = RVar69._signature._bits._bits < uVar10;
              } while (RVar69._signature._bits._bits != uVar10);
              RVar69._id = 0;
              RVar69._signature._bits = uStack_9a4;
            }
            bVar70 = false;
LAB_00127a15:
            RVar67 = RStack_998;
            if ((char)RVar41._signature._bits == '\0') goto LAB_00127a28;
          }
          else {
LAB_00127a28:
            RVar67._signature._bits = RVar67._signature._bits._bits + 1;
            RVar67._id = 0;
            bVar70 = false;
          }
          SVar35 = RVar52._signature._bits;
          uVar10 = uStack_9a4;
        } while (!bVar70);
LAB_00127a35:
        RVar62._id = 0;
        RVar62._signature._bits = SVar35._bits;
        bVar70 = false;
        goto LAB_00126ef3;
      }
      RVar62._id = 0;
      RVar62._signature._bits = EVar9;
    }
    bVar70 = false;
    goto LAB_00126ef3;
  }
  if (RVar58 != (RegOnly)0x0) {
    RVar61._signature._bits = 0;
    RVar61._id = 0;
    RStack_9b8._signature._bits = 0x126ab5;
    RStack_9b8._id = 0;
    Logger::logf((Logger *)RVar58,fVar71);
    goto LAB_00127ba5;
  }
LAB_00127ba2:
  RVar61._signature._bits = 0;
  RVar61._id = 0;
LAB_00127ba5:
  RStack_9b8._signature._bits = 0x127bb2;
  RStack_9b8._id = 0;
  String::reset(&SStack_8b0);
  return (Error)RVar61._signature._bits;
}

Assistant:

Error BaseRAPass::buildCFGViews() noexcept {
#ifndef ASMJIT_NO_LOGGING
  Logger* logger = getLoggerIf(DiagnosticOptions::kRADebugCFG);
  ASMJIT_RA_LOG_FORMAT("[BuildCFGViews]\n");
#endif

  uint32_t count = blockCount();
  if (ASMJIT_UNLIKELY(!count)) return kErrorOk;

  ASMJIT_PROPAGATE(_pov.reserve(allocator(), count));

  ZoneStack<RABlockVisitItem> stack;
  ASMJIT_PROPAGATE(stack.init(allocator()));

  ZoneBitVector visited;
  ASMJIT_PROPAGATE(visited.resize(allocator(), count));

  RABlock* current = _blocks[0];
  uint32_t i = 0;

  for (;;) {
    for (;;) {
      if (i >= current->successors().size())
        break;

      // Skip if already visited.
      RABlock* child = current->successors()[i++];
      if (visited.bitAt(child->blockId()))
        continue;

      // Mark as visited to prevent visiting the same block multiple times.
      visited.setBit(child->blockId(), true);

      // Add the current block on the stack, we will get back to it later.
      ASMJIT_PROPAGATE(stack.append(RABlockVisitItem(current, i)));
      current = child;
      i = 0;
    }

    current->makeReachable();
    current->_povOrder = _pov.size();
    _pov.appendUnsafe(current);

    if (stack.empty())
      break;

    RABlockVisitItem top = stack.pop();
    current = top.block();
    i = top.index();
  }

  ASMJIT_RA_LOG_COMPLEX({
    StringTmp<1024> sb;
    for (RABlock* block : blocks()) {
      sb.clear();
      if (block->hasSuccessors()) {
        sb.appendFormat("  #%u -> {", block->blockId());
        _dumpBlockIds(sb, block->successors());
        sb.append("}\n");
      }
      else {
        sb.appendFormat("  #%u -> {Exit}\n", block->blockId());
      }
      logger->log(sb);
    }
  });

  visited.release(allocator());
  return kErrorOk;
}